

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentProperty(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,string *lhs,string *rhs,CompatibleType t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s2;
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  size_type *psVar7;
  pair<bool,_const_char_*> pVar8;
  string null_ptr;
  allocator<char> local_71;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  __s2 = &local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_4_ = 0x736e7528;
  local_50._M_string_length = 7;
  local_50.field_2._M_allocated_capacity._4_4_ = 0x297465;
  sVar1 = lhs->_M_string_length;
  local_50._M_dataplus._M_p = (pointer)__s2;
  if (sVar1 == 7) {
    iVar5 = bcmp((lhs->_M_dataplus)._M_p,__s2,7);
    if (((iVar5 == 0) && (rhs->_M_string_length == 7)) &&
       (iVar5 = bcmp((rhs->_M_dataplus)._M_p,__s2,7), iVar5 == 0)) {
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      pcVar2 = (lhs->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,pcVar2,pcVar2 + 7);
      goto LAB_002c6ce3;
    }
    iVar5 = bcmp((lhs->_M_dataplus)._M_p,__s2,7);
    if (iVar5 == 0) {
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      pcVar2 = (rhs->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,pcVar2,pcVar2 + rhs->_M_string_length);
      goto LAB_002c6ce3;
    }
  }
  if ((rhs->_M_string_length == 7) && (iVar5 = bcmp((rhs->_M_dataplus)._M_p,__s2,7), iVar5 == 0)) {
    __return_storage_ptr__->first = true;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    pcVar2 = (lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,pcVar2,pcVar2 + sVar1);
  }
  else if (t - NumberMinType < 2) {
    pVar8 = consistentNumberProperty((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,t);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pVar8.second,&local_71)
      ;
    }
    __return_storage_ptr__->first = pVar8.first;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,local_70,local_68 + (long)local_70);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  else if (t == StringType) {
    consistentStringProperty(__return_storage_ptr__,lhs,rhs);
  }
  else {
    if (t != BoolType) {
      __assert_fail("false && \"Unreachable!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                    ,0x1262,
                    "std::pair<bool, std::string> consistentProperty(const std::string &, const std::string &, CompatibleType)"
                   );
    }
    bVar3 = cmSystemTools::IsOn(lhs);
    bVar4 = cmSystemTools::IsOn(rhs);
    bVar3 = bVar3 == bVar4;
    __return_storage_ptr__->first = bVar3;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    psVar6 = &local_50;
    if (bVar3) {
      psVar6 = lhs;
    }
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    psVar7 = &local_50._M_string_length;
    if (bVar3) {
      psVar7 = &lhs->_M_string_length;
    }
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,pcVar2,pcVar2 + *psVar7);
  }
LAB_002c6ce3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != __s2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                             local_50.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> consistentProperty(const std::string& lhs,
                                                const std::string& rhs,
                                                CompatibleType t)
{
  const std::string null_ptr = valueAsString(nullptr);

  if (lhs == null_ptr && rhs == null_ptr) {
    return std::make_pair(true, lhs);
  }
  if (lhs == null_ptr) {
    return std::make_pair(true, rhs);
  }
  if (rhs == null_ptr) {
    return std::make_pair(true, lhs);
  }

  switch (t) {
    case BoolType: {
      bool same = cmSystemTools::IsOn(lhs) == cmSystemTools::IsOn(rhs);
      return std::make_pair(same, same ? lhs : null_ptr);
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType: {
      auto value = consistentNumberProperty(lhs.c_str(), rhs.c_str(), t);
      return std::make_pair(
        value.first, value.first ? std::string(value.second) : null_ptr);
    }
  }
  assert(false && "Unreachable!");
  return std::pair<bool, std::string>(false, null_ptr);
}